

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  int iVar1;
  ulong uVar2;
  mbedtls_md_info_t *pmVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  uchar auStack_58 [8];
  uchar buf [32];
  
  iVar1 = -0x3c;
  if (len < 0x21) {
    iVar7 = 1;
    buf._24_8_ = output;
    do {
      iVar1 = entropy_gather_internal((mbedtls_entropy_context *)data);
      if (iVar1 != 0) goto LAB_001bbde6;
      if (0 < (long)*(int *)((long)data + 0x1c)) {
        uVar4 = 1;
        lVar5 = 0;
        uVar2 = 0;
        do {
          uVar6 = *(ulong *)((long)data + lVar5 + 0x30);
          if (uVar6 < *(ulong *)((long)data + lVar5 + 0x38)) {
            uVar4 = 0;
          }
          if (*(int *)((long)data + lVar5 + 0x40) != 1) {
            uVar6 = 0;
          }
          uVar2 = uVar2 + uVar6;
          lVar5 = lVar5 + 0x28;
        } while ((long)*(int *)((long)data + 0x1c) * 0x28 != lVar5);
        if (((int)uVar4 != 0) && (0x1f < uVar2)) {
          buf[8] = '\0';
          buf[9] = '\0';
          buf[10] = '\0';
          buf[0xb] = '\0';
          buf[0xc] = '\0';
          buf[0xd] = '\0';
          buf[0xe] = '\0';
          buf[0xf] = '\0';
          buf[0x10] = '\0';
          buf[0x11] = '\0';
          buf[0x12] = '\0';
          buf[0x13] = '\0';
          buf[0x14] = '\0';
          buf[0x15] = '\0';
          buf[0x16] = '\0';
          buf[0x17] = '\0';
          auStack_58[0] = '\0';
          auStack_58[1] = '\0';
          auStack_58[2] = '\0';
          auStack_58[3] = '\0';
          auStack_58[4] = '\0';
          auStack_58[5] = '\0';
          auStack_58[6] = '\0';
          auStack_58[7] = '\0';
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
          buf[4] = '\0';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          iVar1 = mbedtls_md_finish((mbedtls_md_context_t *)data,auStack_58);
          if (iVar1 == 0) {
            mbedtls_md_free((mbedtls_md_context_t *)data);
            mbedtls_md_init((mbedtls_md_context_t *)data);
            pmVar3 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
            iVar1 = mbedtls_md_setup((mbedtls_md_context_t *)data,pmVar3,0);
            if (((iVar1 == 0) &&
                (iVar1 = mbedtls_md_starts((mbedtls_md_context_t *)data), iVar1 == 0)) &&
               (iVar1 = mbedtls_md_update((mbedtls_md_context_t *)data,auStack_58,0x20), iVar1 == 0)
               ) {
              pmVar3 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
              iVar1 = mbedtls_md(pmVar3,auStack_58,0x20,auStack_58);
              if (iVar1 == 0) {
                iVar1 = *(int *)((long)data + 0x1c);
                if (0 < (long)iVar1) {
                  lVar5 = 0;
                  do {
                    *(undefined8 *)((long)data + lVar5 + 0x30) = 0;
                    lVar5 = lVar5 + 0x28;
                  } while ((long)iVar1 * 0x28 != lVar5);
                }
                memcpy((void *)buf._24_8_,auStack_58,len);
                iVar1 = 0;
              }
            }
          }
          goto LAB_001bbde6;
        }
      }
      bVar8 = iVar7 != 0x101;
      iVar7 = iVar7 + 1;
    } while (bVar8);
    iVar1 = -0x3c;
LAB_001bbde6:
    mbedtls_platform_zeroize(auStack_58,0x20);
  }
  return iVar1;
}

Assistant:

int mbedtls_entropy_func(void *data, unsigned char *output, size_t len)
{
    int ret, count = 0, i, thresholds_reached;
    size_t strong_size;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if (len > MBEDTLS_ENTROPY_BLOCK_SIZE) {
        return MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
    }

#if defined(MBEDTLS_ENTROPY_NV_SEED)
    /* Update the NV entropy seed before generating any entropy for outside
     * use.
     */
    if (ctx->initial_entropy_run == 0) {
        ctx->initial_entropy_run = 1;
        if ((ret = mbedtls_entropy_update_nv_seed(ctx)) != 0) {
            return ret;
        }
    }
#endif

#if defined(MBEDTLS_THREADING_C)
    if ((ret = mbedtls_mutex_lock(&ctx->mutex)) != 0) {
        return ret;
    }
#endif

    /*
     * Always gather extra entropy before a call
     */
    do {
        if (count++ > ENTROPY_MAX_LOOP) {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if ((ret = entropy_gather_internal(ctx)) != 0) {
            goto exit;
        }

        thresholds_reached = 1;
        strong_size = 0;
        for (i = 0; i < ctx->source_count; i++) {
            if (ctx->source[i].size < ctx->source[i].threshold) {
                thresholds_reached = 0;
            }
            if (ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG) {
                strong_size += ctx->source[i].size;
            }
        }
    } while (!thresholds_reached || strong_size < MBEDTLS_ENTROPY_BLOCK_SIZE);

    memset(buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE);

    /*
     * Note that at this stage it is assumed that the accumulator was started
     * in a previous call to entropy_update(). If this is not guaranteed, the
     * code below will fail.
     */
    if ((ret = mbedtls_md_finish(&ctx->accumulator, buf)) != 0) {
        goto exit;
    }

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_md_free(&ctx->accumulator);
    mbedtls_md_init(&ctx->accumulator);
    ret = mbedtls_md_setup(&ctx->accumulator,
                           mbedtls_md_info_from_type(MBEDTLS_ENTROPY_MD), 0);
    if (ret != 0) {
        goto exit;
    }
    ret = mbedtls_md_starts(&ctx->accumulator);
    if (ret != 0) {
        goto exit;
    }
    if ((ret = mbedtls_md_update(&ctx->accumulator, buf,
                                 MBEDTLS_ENTROPY_BLOCK_SIZE)) != 0) {
        goto exit;
    }

    /*
     * Perform second hashing on entropy
     */
    if ((ret = mbedtls_md(mbedtls_md_info_from_type(MBEDTLS_ENTROPY_MD),
                          buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf)) != 0) {
        goto exit;
    }

    for (i = 0; i < ctx->source_count; i++) {
        ctx->source[i].size = 0;
    }

    memcpy(output, buf, len);

    ret = 0;

exit:
    mbedtls_platform_zeroize(buf, sizeof(buf));

#if defined(MBEDTLS_THREADING_C)
    if (mbedtls_mutex_unlock(&ctx->mutex) != 0) {
        return MBEDTLS_ERR_THREADING_MUTEX_ERROR;
    }
#endif

    return ret;
}